

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_mac.c
# Opt level: O0

void mac_freectx(void *vgctx)

{
  void *in_RDI;
  GOST_CTX_conflict1 *gctx;
  
  EVP_MD_CTX_free(*(undefined8 *)((long)in_RDI + 0x28));
  CRYPTO_free(in_RDI);
  return;
}

Assistant:

static void mac_freectx(void *vgctx)
{
    GOST_CTX *gctx = vgctx;

    /*
     * We don't free gctx->digest here.
     * That will be done by the provider teardown, via
     * GOST_prov_deinit_digests() (defined at the bottom of this file).
     */
    EVP_MD_CTX_free(gctx->dctx);
    OPENSSL_free(gctx);
}